

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O2

void __thiscall gnl::Epoll::~Epoll(Epoll *this)

{
  int in_ESI;
  
  close(this,in_ESI);
  std::_Vector_base<epoll_event,_std::allocator<epoll_event>_>::~_Vector_base
            ((_Vector_base<epoll_event,_std::allocator<epoll_event>_> *)this);
  return;
}

Assistant:

Epoll::~Epoll() {
    this->close();
}